

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O3

uint32_t nd_mul2k(uint32_t *nd,uint32_t ndhi,uint32_t k,uint32_t carry_in,SFormat sf)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar3 = (ulong)carry_in;
  uVar7 = 0;
  if (0x1c < k) {
    uVar4 = ndhi - ((sf >> 0x18) + 0x10 >> 3);
    if ((sf & 0x30) == 0x20) {
      uVar4 = 1;
    }
    if (k < 0x3b) {
      uVar4 = 1;
    }
    uVar7 = 0;
    do {
      uVar2 = (uint32_t)uVar3;
      for (uVar5 = uVar7; uVar5 <= ndhi; uVar5 = uVar5 + 1) {
        uVar6 = uVar3 | (ulong)nd[uVar5] << 0x1d;
        uVar3 = uVar6 / 1000000000;
        uVar2 = (uint32_t)uVar3;
        nd[uVar5] = uVar2 * -1000000000 + (int)uVar6;
      }
      if (uVar2 != 0) {
        uVar3 = (ulong)ndhi;
        ndhi = ndhi + 1;
        nd[uVar3 + 1] = uVar2;
        bVar8 = uVar4 == uVar7;
        uVar4 = uVar4 + 1;
        uVar7 = uVar7 + bVar8;
      }
      k = k - 0x1d;
      uVar3 = 0;
    } while (0x1c < k);
  }
  uVar2 = (uint32_t)uVar3;
  if (k != 0) {
    for (; uVar7 <= ndhi; uVar7 = uVar7 + 1) {
      uVar6 = uVar3 & 0xffffffff | (ulong)nd[uVar7] << ((byte)k & 0x3f);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      uVar3 = SUB168(auVar1 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
      uVar2 = (uint32_t)uVar3;
      nd[uVar7] = uVar2 * -1000000000 + (int)uVar6;
    }
    if (uVar2 != 0) {
      uVar3 = (ulong)ndhi;
      ndhi = ndhi + 1;
      nd[uVar3 + 1] = uVar2;
    }
  }
  return ndhi;
}

Assistant:

static uint32_t nd_mul2k(uint32_t* nd, uint32_t ndhi, uint32_t k,
			 uint32_t carry_in, SFormat sf)
{
  uint32_t i, ndlo = 0, start = 1;
  /* Performance hacks. */
  if (k > ND_MUL2K_MAX_SHIFT*2 && STRFMT_FP(sf) != STRFMT_FP(STRFMT_T_FP_F)) {
    start = ndhi - (STRFMT_PREC(sf) + 17) / 8;
  }
  /* Real logic. */
  while (k >= ND_MUL2K_MAX_SHIFT) {
    for (i = ndlo; i <= ndhi; i++) {
      uint64_t val = ((uint64_t)nd[i] << ND_MUL2K_MAX_SHIFT) | carry_in;
      carry_in = ND_MUL2K_DIV1E9(val);
      nd[i] = (uint32_t)val - carry_in * 1000000000;
    }
    if (carry_in) {
      nd[++ndhi] = carry_in; carry_in = 0;
      if (start++ == ndlo) ++ndlo;
    }
    k -= ND_MUL2K_MAX_SHIFT;
  }
  if (k) {
    for (i = ndlo; i <= ndhi; i++) {
      uint64_t val = ((uint64_t)nd[i] << k) | carry_in;
      carry_in = ND_MUL2K_DIV1E9(val);
      nd[i] = (uint32_t)val - carry_in * 1000000000;
    }
    if (carry_in) nd[++ndhi] = carry_in;
  }
  return ndhi;
}